

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>::
uninitialized_move_n
          (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
          *x,allocator_type *alloc)

{
  slot_type *psVar1;
  slot_type *local_50;
  slot_type *dest;
  slot_type *end;
  slot_type *src;
  allocator_type *alloc_local;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
  *x_local;
  size_type j_local;
  size_type i_local;
  size_type n_local;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
  *this_local;
  
  psVar1 = slot(x,j);
  SanitizerUnpoisonMemoryRegion(psVar1,n << 3);
  end = slot(this,i);
  psVar1 = end + n;
  local_50 = slot(x,j);
  for (; end != psVar1; end = end + 1) {
    common_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true,_phmap::priv::set_slot_policy<long>_>
    ::construct(alloc,local_50,end);
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                                  const size_type j, btree_node *x,
                                  allocator_type *alloc) {
            phmap::priv::SanitizerUnpoisonMemoryRegion(
                x->slot(j), n * sizeof(slot_type));
            for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
                 src != end; ++src, ++dest) {
                params_type::construct(alloc, dest, src);
            }
        }